

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EefcFlash.cpp
# Opt level: O2

void __thiscall EefcFlash::readPage(EefcFlash *this,uint32_t page,uint8_t *data)

{
  WordCopyApplet *this_00;
  uint32_t *puVar1;
  uint32_t *puVar2;
  undefined8 *puVar3;
  uint32_t *puVar4;
  
  if (page < (this->super_Flash)._pages) {
    this_00 = &(this->super_Flash)._wordCopy;
    puVar1 = &(this->super_Flash)._pageBufferA;
    puVar4 = &(this->super_Flash)._pageBufferB;
    puVar2 = puVar4;
    if ((this->super_Flash)._onBufferA != false) {
      puVar2 = puVar1;
    }
    WordCopyApplet::setDstAddr(this_00,*puVar2);
    WordCopyApplet::setSrcAddr(this_00,page * (this->super_Flash)._size + (this->super_Flash)._addr)
    ;
    waitFSR(this,1);
    Applet::runv(&this_00->super_Applet);
    if ((this->super_Flash)._onBufferA != false) {
      puVar4 = puVar1;
    }
    Samba::read((this->super_Flash)._samba,*puVar4,data,(ulong)(this->super_Flash)._size);
    return;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = &PTR__exception_001177a0;
  __cxa_throw(puVar3,&FlashPageError::typeinfo,std::exception::~exception);
}

Assistant:

void
EefcFlash::readPage(uint32_t page, uint8_t* data)
{
    if (page >= _pages)
        throw FlashPageError();

    // The SAM3 firmware has a bug where it returns all zeros for reads
    // directly from the flash so instead, we copy the flash page to
    // SRAM and read it from there.
    _wordCopy.setDstAddr(_onBufferA ? _pageBufferA : _pageBufferB);
    _wordCopy.setSrcAddr(_addr + page * _size);
    waitFSR();
    _wordCopy.runv();
    _samba.read(_onBufferA ? _pageBufferA : _pageBufferB, data, _size);
}